

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall libtorrent::aux::bt_peer_connection::write_bitfield(bt_peer_connection *this)

{
  uint uVar1;
  _Atomic_word *p_Var2;
  undefined1 *puVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  pointer psVar5;
  counters *this_01;
  byte bVar6;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  size_type *psVar13;
  undefined8 __n;
  byte bVar14;
  int val;
  int iVar15;
  char *pcVar16;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *ptVar17;
  pointer psVar18;
  long lVar19;
  int iVar20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  long lVar21;
  byte *__s;
  char *pcVar22;
  element_type *this_03;
  uint uVar23;
  piece_index_t pVar25;
  bool bVar26;
  span<const_char> buf;
  char acStack_88 [8];
  size_type *local_80;
  string bitfield_string;
  byte bVar7;
  byte bVar8;
  int iVar24;
  
  pcVar22 = acStack_88;
  this_03 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
    UNLOCK();
  }
  else {
    p_Var4->_M_weak_count = p_Var4->_M_weak_count + 1;
  }
  iVar15 = p_Var4->_M_use_count;
  do {
    if (iVar15 == 0) {
      this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_03 = (torrent *)0x0;
      goto LAB_0018dd7f;
    }
    LOCK();
    iVar24 = p_Var4->_M_use_count;
    bVar26 = iVar15 == iVar24;
    if (bVar26) {
      p_Var4->_M_use_count = iVar15 + 1;
      iVar24 = iVar15;
    }
    iVar15 = iVar24;
    UNLOCK();
  } while (!bVar26);
  this_02 = p_Var4;
  if (p_Var4->_M_use_count == 0) {
    this_03 = (torrent *)0x0;
  }
LAB_0018dd7f:
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var2 = &p_Var4->_M_weak_count;
    iVar15 = *p_Var2;
    *p_Var2 = *p_Var2 + -1;
    UNLOCK();
  }
  else {
    iVar15 = p_Var4->_M_weak_count;
    p_Var4->_M_weak_count = iVar15 + -1;
  }
  if (iVar15 == 1) {
    (*p_Var4->_vptr__Sp_counted_base[3])();
  }
  if ((this_03->field_0x5cc & 8) != 0) {
    peer_connection::peer_log
              (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, super seeding");
    bVar14 = (this->super_peer_connection).field_0x889;
    if ((bVar14 & 4) != 0) {
      write_have_none(this);
      bVar14 = (this->super_peer_connection).field_0x889;
    }
    (this->super_peer_connection).field_0x889 = bVar14 | 8;
    ptVar17 = peer_connection::get_bitfield(&this->super_peer_connection);
    pVar25 = torrent::get_piece_to_super_seed(this_03,ptVar17);
    if (-1 < pVar25.m_val) {
      peer_connection::superseed_piece
                (&this->super_peer_connection,(piece_index_t)0xffffffff,pVar25);
    }
    ptVar17 = peer_connection::get_bitfield(&this->super_peer_connection);
    pVar25 = torrent::get_piece_to_super_seed(this_03,ptVar17);
    pcVar22 = acStack_88;
    if (-1 < pVar25.m_val) {
      peer_connection::superseed_piece
                (&this->super_peer_connection,(piece_index_t)0xffffffff,pVar25);
      pcVar22 = acStack_88;
    }
    goto LAB_0018e16b;
  }
  if (((this->super_peer_connection).field_0x889 & 4) != 0) {
    bVar26 = torrent::is_seed(this_03);
    if (bVar26) {
      write_have_all(this);
      pcVar22 = acStack_88;
      goto LAB_0018e16b;
    }
    if ((((this->super_peer_connection).field_0x889 & 4) != 0) &&
       (iVar15 = torrent::num_have(this_03), iVar15 == 0)) {
      write_have_none(this);
      pcVar22 = acStack_88;
      goto LAB_0018e16b;
    }
  }
  iVar15 = torrent::num_have(this_03);
  if (iVar15 == 0) {
    peer_connection::peer_log
              (&this->super_peer_connection,info,"BITFIELD","not sending bitfield, have none");
    puVar3 = &(this->super_peer_connection).field_0x889;
    *puVar3 = *puVar3 | 8;
    pcVar22 = acStack_88;
  }
  else {
    iVar15 = (((this_03->super_torrent_hot_members).m_torrent_file.
               super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             m_files).m_num_pieces;
    iVar24 = iVar15 + 0xe;
    if (-1 < iVar15 + 7) {
      iVar24 = iVar15 + 7;
    }
    uVar23 = iVar24 >> 3;
    lVar21 = (long)(int)uVar23;
    if ((long)iVar15 < 0x7fd9) {
      pcVar22 = acStack_88;
      if (iVar15 < -0x2e) goto LAB_0018e16b;
      pcVar22 = acStack_88 + -(lVar21 + 0x14U & 0x1fffffff0);
      pcVar16 = pcVar22;
    }
    else {
      pcVar16 = (char *)operator_new__(lVar21 + 5U);
    }
    uVar1 = uVar23 + 1;
    uVar10 = (ushort)((uVar1 & 0xff00ff) >> 0x10);
    uVar11 = (ushort)(uVar1 >> 8) & 0xff;
    uVar12 = (ushort)(uVar1 & 0xff00ff);
    bVar14 = (byte)(uVar1 >> 0x18);
    uVar9 = (ushort)bVar14;
    bVar14 = (uVar9 != 0) * (uVar9 < 0x100) * bVar14 - (0xff < uVar9);
    bVar6 = ((uVar1 & 0xff0000) != 0) * (uVar10 < 0x100) * (char)(uVar1 >> 0x10) - (0xff < uVar10);
    bVar7 = ((uVar1 & 0xff00) != 0) * (uVar11 < 0x100) * (char)(uVar1 >> 8) - (0xff < uVar11);
    bVar8 = ((uVar1 & 0xff) != 0) * (uVar12 < 0x100) * (char)uVar1 - (0xff < uVar12);
    bitfield_string.field_2._8_8_ = lVar21;
    *(uint *)pcVar16 =
         CONCAT13((bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8),
                  CONCAT12((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                           CONCAT11((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                                    (bVar14 != 0) * (bVar14 < 0x100) * bVar14 - (0xff < bVar14))));
    pcVar16[4] = '\x05';
    pcVar22[-8] = -0x57;
    pcVar22[-7] = -0x21;
    pcVar22[-6] = '\x18';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    bVar26 = torrent::is_seed(this_03);
    __n = bitfield_string.field_2._8_8_;
    __s = (byte *)(pcVar16 + 5);
    if (bVar26) {
      if (0 < iVar15) {
        pcVar22[-8] = -0x36;
        pcVar22[-7] = -0x21;
        pcVar22[-6] = '\x18';
        pcVar22[-5] = '\0';
        pcVar22[-4] = '\0';
        pcVar22[-3] = '\0';
        pcVar22[-2] = '\0';
        pcVar22[-1] = '\0';
        memset(__s,0xff,(ulong)uVar23);
      }
      pcVar16[lVar21 + 4] = (char)(0xff << (-(char)iVar15 & 7U));
    }
    else {
      pVar25.m_val = 0;
      pcVar22[-8] = -0xb;
      pcVar22[-7] = -0x21;
      pcVar22[-6] = '\x18';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      memset(__s,0,__n);
      if (0 < iVar15) {
        this_00._M_head_impl =
             (this_03->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
        uVar23 = 0x80;
        do {
          pcVar22[-8] = '\x13';
          pcVar22[-7] = -0x20;
          pcVar22[-6] = '\x18';
          pcVar22[-5] = '\0';
          pcVar22[-4] = '\0';
          pcVar22[-3] = '\0';
          pcVar22[-2] = '\0';
          pcVar22[-1] = '\0';
          bVar26 = piece_picker::have_piece(this_00._M_head_impl,pVar25);
          if (bVar26) {
            *__s = *__s | (byte)uVar23;
          }
          __s = __s + (uVar23 < 2);
          bVar26 = uVar23 < 2;
          uVar23 = (int)uVar23 >> 1;
          if (bVar26) {
            uVar23 = 0x80;
          }
          pVar25.m_val = pVar25.m_val + 1;
        } while (iVar15 != pVar25.m_val);
      }
    }
    psVar5 = (this_03->m_predictive_pieces).
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar18 = (this_03->m_predictive_pieces).
                   super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar18 != psVar5;
        psVar18 = psVar18 + 1) {
      iVar24 = psVar18->m_val;
      iVar20 = iVar24 + 7;
      if (-1 < iVar24) {
        iVar20 = iVar24;
      }
      pcVar16[(long)(iVar20 >> 3) + 5] =
           pcVar16[(long)(iVar20 >> 3) + 5] | (byte)(0x80 >> ((byte)iVar24 & 7));
    }
    pcVar22[-8] = -0x71;
    pcVar22[-7] = -0x20;
    pcVar22[-6] = '\x18';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    bVar26 = peer_connection::should_log(&this->super_peer_connection,outgoing_message);
    if (bVar26) {
      bitfield_string._M_dataplus._M_p = (pointer)0x0;
      bitfield_string._M_string_length._0_1_ = 0;
      local_80 = &bitfield_string._M_string_length;
      pcVar22[-8] = -0x47;
      pcVar22[-7] = -0x20;
      pcVar22[-6] = '\x18';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      ::std::__cxx11::string::resize((ulong)&local_80,(char)iVar15);
      psVar13 = local_80;
      if (iVar15 != 0) {
        lVar19 = 0;
        do {
          iVar24 = (int)lVar19;
          iVar20 = iVar24 + 7;
          if (-1 < iVar24) {
            iVar20 = iVar24;
          }
          *(byte *)((long)local_80 + lVar19) =
               (byte)~(pcVar16[(long)(iVar20 >> 3) + 5] << ((byte)lVar19 & 7)) >> 7 ^ 0x31;
          lVar19 = lVar19 + 1;
        } while (iVar15 != lVar19);
      }
      pcVar22[-8] = '\x14';
      pcVar22[-7] = -0x1f;
      pcVar22[-6] = '\x18';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      peer_connection::peer_log
                (&this->super_peer_connection,outgoing_message,"BITFIELD","%s",psVar13);
      psVar13 = local_80;
      if (local_80 != &bitfield_string._M_string_length) {
        lVar19 = CONCAT71(bitfield_string._M_string_length._1_7_,
                          (undefined1)bitfield_string._M_string_length);
        pcVar22[-8] = ')';
        pcVar22[-7] = -0x1f;
        pcVar22[-6] = '\x18';
        pcVar22[-5] = '\0';
        pcVar22[-4] = '\0';
        pcVar22[-3] = '\0';
        pcVar22[-2] = '\0';
        pcVar22[-1] = '\0';
        operator_delete(psVar13,lVar19 + 1);
      }
    }
    puVar3 = &(this->super_peer_connection).field_0x889;
    *puVar3 = *puVar3 | 8;
    pcVar22[-8] = '@';
    pcVar22[-7] = -0x1f;
    pcVar22[-6] = '\x18';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    buf.m_len = lVar21 + 5U;
    buf.m_ptr = pcVar16;
    peer_connection::send_buffer(&this->super_peer_connection,buf);
    this_01 = (this->super_peer_connection).m_counters;
    pcVar22[-8] = 'Z';
    pcVar22[-7] = -0x1f;
    pcVar22[-6] = '\x18';
    pcVar22[-5] = '\0';
    pcVar22[-4] = '\0';
    pcVar22[-3] = '\0';
    pcVar22[-2] = '\0';
    pcVar22[-1] = '\0';
    counters::inc_stats_counter(this_01,0x5a,1);
    if (0x7fd8 < iVar15) {
      pcVar22[-8] = 'k';
      pcVar22[-7] = -0x1f;
      pcVar22[-6] = '\x18';
      pcVar22[-5] = '\0';
      pcVar22[-4] = '\0';
      pcVar22[-3] = '\0';
      pcVar22[-2] = '\0';
      pcVar22[-1] = '\0';
      operator_delete__(pcVar16);
    }
  }
LAB_0018e16b:
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    *(undefined8 *)(pcVar22 + -8) = 0x18e179;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  return;
}

Assistant:

void bt_peer_connection::write_bitfield()
	{
		INVARIANT_CHECK;

		// if we have not received the other peer's extension bits yet, how do we
		// know whether to send a have-all or have-none?
		TORRENT_ASSERT(m_state >= state_t::read_peer_id);

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);
		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(t->valid_metadata());

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, super seeding");
#endif
			if (m_supports_fast) write_have_none();

			// if we are super seeding, pretend to not have any piece
			// and don't send a bitfield
			m_sent_bitfield = true;

			// bootstrap super-seeding by sending two have message
			piece_index_t piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			return;
		}
		else
#endif
			if (m_supports_fast && t->is_seed())
		{
			write_have_all();
			return;
		}
		else if (m_supports_fast && t->num_have() == 0)
		{
			write_have_none();
			return;
		}
		else if (t->num_have() == 0)
		{
			// don't send a bitfield if we don't have any pieces
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, have none");
#endif
			m_sent_bitfield = true;
			return;
		}

		const int num_pieces = t->torrent_file().num_pieces();
		TORRENT_ASSERT(num_pieces > 0);

		constexpr std::uint8_t char_bit_mask = CHAR_BIT - 1;
		constexpr std::uint8_t char_top_bit = 1 << (CHAR_BIT - 1);

		const int packet_size = (num_pieces + char_bit_mask) / CHAR_BIT + 5;

		TORRENT_ALLOCA(msg, char, packet_size);
		if (msg.data() == nullptr) return; // out of memory
		auto ptr = msg.begin();

		aux::write_int32(packet_size - 4, ptr);
		aux::write_uint8(msg_bitfield, ptr);

		if (t->is_seed())
		{
			std::fill_n(ptr, packet_size - 5, std::uint8_t{0xff});

			// Clear trailing bits
			msg.back() = static_cast<char>((0xff << ((CHAR_BIT - (num_pieces & char_bit_mask)) & char_bit_mask)) & 0xff);
		}
		else
		{
			std::memset(ptr, 0, aux::numeric_cast<std::size_t>(packet_size - 5));
			piece_picker const& p = t->picker();
			int mask = char_top_bit;
			for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
			{
				if (p.have_piece(i)) *ptr |= mask;
				mask >>= 1;
				if (mask == 0)
				{
					mask = char_top_bit;
					++ptr;
				}
			}
		}

#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		// add predictive pieces to the bitfield as well, since we won't
		// announce them again
		for (piece_index_t const p : t->predictive_pieces())
			msg[5 + static_cast<int>(p) / CHAR_BIT] |= (char_top_bit >> (static_cast<int>(p) & char_bit_mask));
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			std::string bitfield_string;
			auto const n_pieces = aux::numeric_cast<std::size_t>(num_pieces);
			bitfield_string.resize(n_pieces);
			for (std::size_t k = 0; k < n_pieces; ++k)
			{
				if (msg[5 + int(k) / CHAR_BIT] & (char_top_bit >> (k % CHAR_BIT))) bitfield_string[k] = '1';
				else bitfield_string[k] = '0';
			}
			peer_log(peer_log_alert::outgoing_message, "BITFIELD"
				, "%s", bitfield_string.c_str());
		}
#endif
		m_sent_bitfield = true;

		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_bitfield);
	}